

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscenebsptreeindex.cpp
# Opt level: O1

void QGraphicsSceneBspTreeIndexPrivate::climbTree(QGraphicsItem *item,int *stackingOrder)

{
  qreal *pqVar1;
  QGraphicsItem **ppQVar2;
  long lVar3;
  double dVar4;
  int iVar5;
  QGraphicsItemPrivate *pQVar6;
  QGraphicsItem *pQVar7;
  QGraphicsItemPrivate *pQVar8;
  GraphicsItemFlags GVar9;
  iterator __first;
  iterator __last;
  ulong uVar10;
  QGraphicsItem **ppQVar11;
  iterator iVar12;
  uint uVar13;
  QGraphicsItem **ppQVar14;
  value_type __val_2;
  value_type __val;
  size_t __n;
  long lVar15;
  iterator iVar16;
  long lVar17;
  iterator __i;
  QGraphicsItem **ppQVar18;
  long in_FS_OFFSET;
  bool bVar19;
  QList<QGraphicsItem_*> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar6 = (item->d_ptr).d;
  uVar10 = (pQVar6->children).d.size;
  if (uVar10 == 0) {
    iVar5 = *stackingOrder;
    *stackingOrder = iVar5 + 1;
    pQVar6->globalStackingOrder = iVar5;
  }
  else {
    local_58.d.d = (pQVar6->children).d.d;
    local_58.d.ptr = (pQVar6->children).d.ptr;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
      super___atomic_base<int>._M_i =
           (((QArrayData *)&((local_58.d.d)->super_QArrayData).ref_)->ref_)._q_value.
           super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_58.d.size = uVar10;
    __first = QList<QGraphicsItem_*>::begin(&local_58);
    __last = QList<QGraphicsItem_*>::end(&local_58);
    if (__first.i != __last.i) {
      uVar10 = (long)__last.i - (long)__first.i >> 3;
      lVar17 = 0x3f;
      if (uVar10 != 0) {
        for (; uVar10 >> lVar17 == 0; lVar17 = lVar17 + -1) {
        }
      }
      std::
      __introsort_loop<QList<QGraphicsItem*>::iterator,long_long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(QGraphicsItem_const*,QGraphicsItem_const*)>>
                (__first,__last,(ulong)(((uint)lVar17 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_QGraphicsItem_*,_const_QGraphicsItem_*)>)0x6340a9);
      ppQVar18 = __first.i + 1;
      iVar12 = __first;
      if ((long)__last.i - (long)__first.i < 0x81) {
        for (; ppQVar18 != __last.i; ppQVar18 = ppQVar18 + 1) {
          pQVar7 = *ppQVar18;
          pQVar6 = (pQVar7->d_ptr).d;
          pQVar8 = ((*__first.i)->d_ptr).d;
          uVar10 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
          uVar13 = (uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1;
          if (uVar13 == (uint)(uVar10 >> 0x28)) {
            dVar4 = pQVar6->z;
            pqVar1 = &pQVar8->z;
            if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
              bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
            }
            else {
              bVar19 = pQVar8->siblingIndex < pQVar6->siblingIndex;
            }
          }
          else {
            bVar19 = uVar10 != 0;
          }
          if (bVar19) {
            lVar17 = (long)ppQVar18 - (long)__first.i >> 3;
            iVar16 = __first;
            if (0 < lVar17) {
              lVar15 = 1;
              do {
                iVar12.i[lVar15] = iVar12.i[lVar15 + -1];
                lVar3 = lVar17 + lVar15;
                lVar15 = lVar15 + -1;
              } while (1 < lVar3 + -1);
            }
          }
          else {
            pQVar8 = ((*iVar12.i)->d_ptr).d;
            uVar10 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
            if (uVar13 == (uint)(uVar10 >> 0x28)) {
              dVar4 = pQVar6->z;
              pqVar1 = &pQVar8->z;
              if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
              }
              else {
                bVar19 = pQVar8->siblingIndex < pQVar6->siblingIndex;
              }
            }
            else {
              bVar19 = uVar10 != 0;
            }
            iVar16.i = ppQVar18;
            ppQVar14 = ppQVar18;
            if (bVar19) {
              do {
                *ppQVar14 = ppQVar14[-1];
                pQVar6 = (pQVar7->d_ptr).d;
                pQVar8 = (ppQVar14[-2]->d_ptr).d;
                uVar10 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                    (uint)(uVar10 >> 0x28)) {
                  dVar4 = pQVar6->z;
                  pqVar1 = &pQVar8->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar19 = pQVar8->siblingIndex < pQVar6->siblingIndex;
                  }
                }
                else {
                  bVar19 = uVar10 != 0;
                }
                iVar16.i = ppQVar14 + -1;
                ppQVar14 = ppQVar14 + -1;
              } while (bVar19);
            }
          }
          *iVar16.i = pQVar7;
          iVar12.i = iVar12.i + 1;
        }
      }
      else {
        __n = 8;
        ppQVar14 = ppQVar18;
        do {
          pQVar7 = *(QGraphicsItem **)((long)__first.i + __n);
          pQVar6 = (pQVar7->d_ptr).d;
          pQVar8 = ((*__first.i)->d_ptr).d;
          uVar10 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
          uVar13 = (uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1;
          if (uVar13 == (uint)(uVar10 >> 0x28)) {
            dVar4 = pQVar6->z;
            pqVar1 = &pQVar8->z;
            if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
              bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
            }
            else {
              bVar19 = pQVar8->siblingIndex < pQVar6->siblingIndex;
            }
          }
          else {
            bVar19 = uVar10 != 0;
          }
          ppQVar2 = __first.i + __n;
          if (bVar19) {
            memmove(ppQVar18,__first.i,__n);
            iVar12 = __first;
          }
          else {
            pQVar8 = ((*iVar12.i)->d_ptr).d;
            uVar10 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
            if (uVar13 == (uint)(uVar10 >> 0x28)) {
              dVar4 = pQVar6->z;
              pqVar1 = &pQVar8->z;
              if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
              }
              else {
                bVar19 = pQVar8->siblingIndex < pQVar6->siblingIndex;
              }
            }
            else {
              bVar19 = uVar10 != 0;
            }
            iVar12.i = ppQVar2;
            ppQVar11 = ppQVar14;
            if (bVar19) {
              do {
                *ppQVar11 = ppQVar11[-1];
                pQVar6 = (pQVar7->d_ptr).d;
                pQVar8 = (ppQVar11[-2]->d_ptr).d;
                uVar10 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
                if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                    (uint)(uVar10 >> 0x28)) {
                  dVar4 = pQVar6->z;
                  pqVar1 = &pQVar8->z;
                  if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                    bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                  }
                  else {
                    bVar19 = pQVar8->siblingIndex < pQVar6->siblingIndex;
                  }
                }
                else {
                  bVar19 = uVar10 != 0;
                }
                iVar12.i = ppQVar11 + -1;
                ppQVar11 = iVar12.i;
              } while (bVar19);
            }
          }
          *iVar12.i = pQVar7;
          __n = __n + 8;
          ppQVar14 = ppQVar14 + 1;
          iVar12.i = ppQVar2;
        } while (__n != 0x80);
        for (ppQVar18 = __first.i + 0x10; ppQVar18 != __last.i; ppQVar18 = ppQVar18 + 1) {
          pQVar7 = *ppQVar18;
          pQVar6 = (pQVar7->d_ptr).d;
          pQVar8 = (ppQVar18[-1]->d_ptr).d;
          uVar10 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
          if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
              (uint)(uVar10 >> 0x28)) {
            dVar4 = pQVar6->z;
            pqVar1 = &pQVar8->z;
            if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
              bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
            }
            else {
              bVar19 = pQVar8->siblingIndex < pQVar6->siblingIndex;
            }
          }
          else {
            bVar19 = uVar10 != 0;
          }
          ppQVar14 = ppQVar18;
          if (bVar19) {
            do {
              *ppQVar14 = ppQVar14[-1];
              pQVar6 = (pQVar7->d_ptr).d;
              pQVar8 = (ppQVar14[-2]->d_ptr).d;
              uVar10 = *(ulong *)&pQVar8->field_0x160 & 0x10000000000;
              if (((uint)((ulong)*(undefined8 *)&pQVar6->field_0x160 >> 0x28) & 1) ==
                  (uint)(uVar10 >> 0x28)) {
                dVar4 = pQVar6->z;
                pqVar1 = &pQVar8->z;
                if ((dVar4 != *pqVar1) || (NAN(dVar4) || NAN(*pqVar1))) {
                  bVar19 = *pqVar1 <= dVar4 && dVar4 != *pqVar1;
                }
                else {
                  bVar19 = pQVar8->siblingIndex < pQVar6->siblingIndex;
                }
              }
              else {
                bVar19 = uVar10 != 0;
              }
              ppQVar14 = ppQVar14 + -1;
            } while (bVar19);
          }
          *ppQVar14 = pQVar7;
        }
      }
    }
    if (local_58.d.size != 0) {
      uVar10 = 0;
      do {
        GVar9 = QGraphicsItem::flags(local_58.d.ptr[uVar10]);
        if (((uint)GVar9.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                   super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 8 & 1) == 0) {
          climbTree(local_58.d.ptr[uVar10],stackingOrder);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)local_58.d.size);
    }
    iVar5 = *stackingOrder;
    *stackingOrder = iVar5 + 1;
    ((item->d_ptr).d)->globalStackingOrder = iVar5;
    if (local_58.d.size != 0) {
      uVar10 = 0;
      do {
        GVar9 = QGraphicsItem::flags(local_58.d.ptr[uVar10]);
        if (((uint)GVar9.super_QFlagsStorageHelper<QGraphicsItem::GraphicsItemFlag,_4>.
                   super_QFlagsStorage<QGraphicsItem::GraphicsItemFlag>.i >> 8 & 1) != 0) {
          climbTree(local_58.d.ptr[uVar10],stackingOrder);
        }
        uVar10 = uVar10 + 1;
      } while (uVar10 < (ulong)local_58.d.size);
    }
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,8,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QGraphicsSceneBspTreeIndexPrivate::climbTree(QGraphicsItem *item, int *stackingOrder)
{
    if (!item->d_ptr->children.isEmpty()) {
        QList<QGraphicsItem *> childList = item->d_ptr->children;
        std::sort(childList.begin(), childList.end(), qt_closestLeaf);
        for (int i = 0; i < childList.size(); ++i) {
            QGraphicsItem *item = childList.at(i);
            if (!(item->flags() & QGraphicsItem::ItemStacksBehindParent))
                climbTree(childList.at(i), stackingOrder);
        }
        item->d_ptr->globalStackingOrder = (*stackingOrder)++;
        for (int i = 0; i < childList.size(); ++i) {
            QGraphicsItem *item = childList.at(i);
            if (item->flags() & QGraphicsItem::ItemStacksBehindParent)
                climbTree(childList.at(i), stackingOrder);
        }
    } else {
        item->d_ptr->globalStackingOrder = (*stackingOrder)++;
    }
}